

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O3

int class_increment_reference(klass cls)

{
  int iVar1;
  
  iVar1 = 1;
  if ((cls != (klass)0x0) && ((cls->ref).count != 0xffffffffffffffff)) {
    LOCK();
    (cls->ref).count = (cls->ref).count + 1;
    UNLOCK();
    LOCK();
    class_stats.increments = class_stats.increments + 1;
    UNLOCK();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int class_increment_reference(klass cls)
{
	if (cls == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_increment(&cls->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_increment(class_stats);

	return 0;
}